

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z80.cpp
# Opt level: O3

Operand * literal(Operand *__return_storage_ptr__,int i)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  uint __val;
  uint __len;
  string __str;
  string local_50;
  
  __val = -i;
  if (0 < i) {
    __val = i;
  }
  __len = 1;
  if (9 < __val) {
    uVar3 = (ulong)__val;
    uVar1 = 4;
    do {
      __len = uVar1;
      uVar2 = (uint)uVar3;
      if (uVar2 < 100) {
        __len = __len - 2;
        goto LAB_00116612;
      }
      if (uVar2 < 1000) {
        __len = __len - 1;
        goto LAB_00116612;
      }
      if (uVar2 < 10000) goto LAB_00116612;
      uVar3 = uVar3 / 10000;
      uVar1 = __len + 4;
    } while (99999 < uVar2);
    __len = __len + 1;
  }
LAB_00116612:
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_50,(char)__len - (char)(i >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            (local_50._M_dataplus._M_p + ((uint)i >> 0x1f),__len,__val);
  Operand::Operand(__return_storage_ptr__,literal,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

Operand literal(int i) {
	return Operand(Operand::Type::literal, std::to_string(i));
}